

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O1

void __thiscall
fasttext::Dictionary::pushHash
          (Dictionary *this,vector<int,_std::allocator<int>_> *hashes,int32_t id)

{
  iterator __position;
  int iVar1;
  undefined8 in_RAX;
  size_type sVar2;
  uint *puVar3;
  undefined8 local_28;
  
  local_28 = CONCAT44((int)((ulong)in_RAX >> 0x20),id);
  if (-1 < id && this->pruneidx_size_ != 0) {
    if (0 < this->pruneidx_size_) {
      sVar2 = std::
              _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::count(&(this->pruneidx_)._M_h,(key_type_conflict *)&local_28);
      if (sVar2 == 0) {
        return;
      }
      puVar3 = (uint *)std::__detail::
                       _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::at((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->pruneidx_,(key_type *)&local_28);
      local_28 = (ulong)*puVar3;
    }
    iVar1 = (int)local_28 + this->nwords_;
    local_28 = CONCAT44(iVar1,(int)local_28);
    __position._M_current =
         (hashes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (__position._M_current ==
        (hashes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (hashes,__position,(int *)((long)&local_28 + 4));
    }
    else {
      *__position._M_current = iVar1;
      (hashes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = __position._M_current + 1;
    }
  }
  return;
}

Assistant:

void Dictionary::pushHash(std::vector<int32_t>& hashes, int32_t id) const {
  if (pruneidx_size_ == 0 || id < 0) {
    return;
  }
  if (pruneidx_size_ > 0) {
    if (pruneidx_.count(id)) {
      id = pruneidx_.at(id);
    } else {
      return;
    }
  }
  hashes.push_back(nwords_ + id);
}